

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_avx2.c
# Opt level: O2

void highbd_blend_a64_d16_mask_w4_avx2
               (uint16_t *dst,int dst_stride,CONV_BUF_TYPE *src0,int src0_stride,CONV_BUF_TYPE *src1
               ,int src1_stride,__m256i *mask0,__m256i *round_offset,int shift,__m256i *clip_low,
               __m256i *clip_high,__m256i *mask_max)

{
  __m256i alVar1;
  undefined8 uVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)src0;
  auVar7 = vmovhps_avx(auVar7,*(undefined8 *)(src0 + src0_stride));
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(src0 + src0_stride * 2);
  auVar9 = vmovhps_avx(auVar9,*(undefined8 *)(src0 + src0_stride * 3));
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)src1;
  auVar11 = vmovhps_avx(auVar11,*(undefined8 *)(src1 + src1_stride));
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(src1 + src1_stride * 2);
  auVar12 = vmovhps_avx(auVar12,*(undefined8 *)(src1 + src1_stride * 3));
  auVar8._16_16_ = auVar9;
  auVar8._0_16_ = auVar7;
  auVar10._16_16_ = auVar12;
  auVar10._0_16_ = auVar11;
  alVar1 = *mask0;
  auVar4 = vpsubw_avx2((undefined1  [32])*mask_max,(undefined1  [32])alVar1);
  auVar3 = vpmulhuw_avx2((undefined1  [32])alVar1,auVar8);
  auVar8 = vpmullw_avx2((undefined1  [32])alVar1,auVar8);
  auVar5 = vpunpckhwd_avx2(auVar8,auVar3);
  auVar6 = vpunpcklwd_avx2(auVar8,auVar3);
  auVar3 = vpmulhuw_avx2(auVar4,auVar10);
  auVar8 = vpmullw_avx2(auVar4,auVar10);
  auVar4 = vpunpckhwd_avx2(auVar8,auVar3);
  auVar10 = vpunpcklwd_avx2(auVar8,auVar3);
  auVar3 = vpsubd_avx2(auVar5,(undefined1  [32])*round_offset);
  auVar3 = vpaddd_avx2(auVar3,auVar4);
  auVar8 = vpsrad_avx2(auVar3,ZEXT416((uint)shift));
  auVar3 = vpsubd_avx2(auVar6,(undefined1  [32])*round_offset);
  auVar3 = vpaddd_avx2(auVar3,auVar10);
  auVar3 = vpsrad_avx2(auVar3,ZEXT416((uint)shift));
  auVar3 = vpackssdw_avx2(auVar3,auVar8);
  auVar3 = vpmaxsw_avx2(auVar3,(undefined1  [32])*clip_low);
  auVar3 = vpminsw_avx2(auVar3,(undefined1  [32])*clip_high);
  uVar2 = vpextrq_avx(auVar3._16_16_,1);
  *(undefined8 *)(dst + dst_stride * 3) = uVar2;
  *(long *)(dst + dst_stride * 2) = auVar3._16_8_;
  uVar2 = vpextrq_avx(auVar3._0_16_,1);
  *(undefined8 *)(dst + dst_stride) = uVar2;
  *(long *)dst = auVar3._0_8_;
  return;
}

Assistant:

static inline void highbd_blend_a64_d16_mask_w4_avx2(
    uint16_t *dst, int dst_stride, const CONV_BUF_TYPE *src0, int src0_stride,
    const CONV_BUF_TYPE *src1, int src1_stride, const __m256i *mask0,
    const __m256i *round_offset, int shift, const __m256i *clip_low,
    const __m256i *clip_high, const __m256i *mask_max) {
  // Load 4x u16 pixels from each of 4 rows from each source
  const __m256i s0 =
      yy_loadu_4x64(src0 + 3 * src0_stride, src0 + 2 * src0_stride,
                    src0 + 1 * src0_stride, src0 + 0 * src0_stride);
  const __m256i s1 =
      yy_loadu_4x64(src1 + 3 * src1_stride, src1 + 2 * src1_stride,
                    src1 + 1 * src1_stride, src1 + 0 * src1_stride);
  // Generate the inverse mask
  const __m256i mask1 = _mm256_sub_epi16(*mask_max, *mask0);

  // Multiply each mask by the respective source
  const __m256i mul0_highs = _mm256_mulhi_epu16(*mask0, s0);
  const __m256i mul0_lows = _mm256_mullo_epi16(*mask0, s0);
  const __m256i mul0h = _mm256_unpackhi_epi16(mul0_lows, mul0_highs);
  const __m256i mul0l = _mm256_unpacklo_epi16(mul0_lows, mul0_highs);
  // Note that AVX2 unpack orders 64-bit words as [3 1] [2 0] to keep within
  // lanes Later, packs does the same again which cancels this out with no need
  // for a permute.  The intermediate values being reordered makes no difference

  const __m256i mul1_highs = _mm256_mulhi_epu16(mask1, s1);
  const __m256i mul1_lows = _mm256_mullo_epi16(mask1, s1);
  const __m256i mul1h = _mm256_unpackhi_epi16(mul1_lows, mul1_highs);
  const __m256i mul1l = _mm256_unpacklo_epi16(mul1_lows, mul1_highs);

  const __m256i sumh = _mm256_add_epi32(mul0h, mul1h);
  const __m256i suml = _mm256_add_epi32(mul0l, mul1l);

  const __m256i roundh =
      _mm256_srai_epi32(_mm256_sub_epi32(sumh, *round_offset), shift);
  const __m256i roundl =
      _mm256_srai_epi32(_mm256_sub_epi32(suml, *round_offset), shift);

  const __m256i pack = _mm256_packs_epi32(roundl, roundh);
  const __m256i clip =
      _mm256_min_epi16(_mm256_max_epi16(pack, *clip_low), *clip_high);

  // _mm256_extract_epi64 doesn't exist on x86, so do it the old-fashioned way:
  const __m128i cliph = _mm256_extracti128_si256(clip, 1);
  xx_storel_64(dst + 3 * dst_stride, _mm_srli_si128(cliph, 8));
  xx_storel_64(dst + 2 * dst_stride, cliph);
  const __m128i clipl = _mm256_castsi256_si128(clip);
  xx_storel_64(dst + 1 * dst_stride, _mm_srli_si128(clipl, 8));
  xx_storel_64(dst + 0 * dst_stride, clipl);
}